

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O3

bool __thiscall Http2::FrameReader::readHeader(FrameReader *this,QIODevice *socket)

{
  ulong uVar1;
  long lVar2;
  quint32 qVar3;
  pointer puVar4;
  
  puVar4 = (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = (long)(this->frame).buffer.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  if (uVar1 < 9) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&(this->frame).buffer,9);
    puVar4 = (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = (long)(this->frame).buffer.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar4;
  }
  if (this->offset < uVar1) {
    lVar2 = QIODevice::read((char *)socket,(longlong)(puVar4 + this->offset));
    qVar3 = this->offset;
    if (0 < lVar2) {
      qVar3 = qVar3 + (int)lVar2;
      this->offset = qVar3;
    }
    return qVar3 == 9;
  }
  readHeader();
}

Assistant:

bool FrameReader::readHeader(QIODevice &socket)
{
    Q_ASSERT(offset < frameHeaderSize);

    auto &buffer = frame.buffer;
    if (buffer.size() < frameHeaderSize)
        buffer.resize(frameHeaderSize);

    const auto chunkSize = socket.read(reinterpret_cast<char *>(&buffer[offset]),
                                       frameHeaderSize - offset);
    if (chunkSize > 0)
        offset += chunkSize;

    return offset == frameHeaderSize;
}